

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3843.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementHexaANCF_3843::ComputeInternalForcesContIntNoDamping
          (ChElementHexaANCF_3843 *this,ChVectorDynamic<> *Fi)

{
  double *pdVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  ulong uVar38;
  undefined1 (*pauVar39) [64];
  element_type *peVar40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  ulong uVar48;
  void *pvVar49;
  undefined8 *puVar50;
  double *pdVar51;
  char *pcVar52;
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  VectorNIP SPK2_4_Block;
  VectorNIP SPK2_5_Block;
  VectorNIP E1_Block;
  ChMatrixNMc<double,_3_*_NIP,_3> FC;
  VectorNIP SPK2_3_Block;
  VectorNIP E3_Block;
  VectorNIP E2_Block;
  VectorNIP E6_Block;
  VectorNIP E5_Block;
  VectorNIP E4_Block;
  VectorNIP SPK2_6_Block;
  VectorNIP SPK2_2_Block;
  VectorNIP SPK2_1_Block;
  ChMatrixNMc<double,_3_*_NIP,_3> P_Block;
  MatrixNx3 QiCompact;
  Matrix3xN e_bar;
  Scalar local_5608;
  undefined1 local_5600 [64];
  undefined1 local_55c0 [64];
  undefined1 local_5580 [64];
  undefined1 local_5540 [64];
  undefined1 local_5500 [64];
  undefined1 local_54c0 [64];
  undefined1 local_5480 [64];
  undefined1 local_5440 [64];
  undefined1 local_5400 [64];
  undefined1 local_53c0 [64];
  undefined1 local_5380 [64];
  undefined1 local_5340 [64];
  undefined1 local_5300 [64];
  undefined1 local_52c0 [64];
  undefined1 local_5280 [64];
  undefined1 local_5240 [64];
  undefined1 local_5200 [64];
  undefined1 local_51c0 [64];
  undefined1 local_5180 [64];
  undefined1 local_5140 [64];
  undefined1 local_5100 [64];
  undefined1 local_50c0 [64];
  undefined1 local_5080 [64];
  undefined1 local_5040 [64];
  undefined1 local_5000 [64];
  undefined1 local_4fc0 [64];
  undefined1 local_4f80 [64];
  undefined1 local_4f40 [64];
  undefined1 local_4f00 [64];
  undefined1 local_4ec0 [64];
  undefined1 local_4e80 [64];
  undefined1 local_4e40 [64];
  undefined1 local_4e00 [64];
  undefined1 local_4dc0 [64];
  undefined1 local_4d80 [64];
  undefined1 local_4d40 [64];
  undefined1 local_4d00 [64];
  undefined1 local_4cc0 [64];
  undefined1 local_4c80 [64];
  undefined1 local_4c40 [64];
  undefined1 local_4c00 [64];
  undefined1 local_4bc0 [64];
  undefined1 local_4b80 [64];
  undefined1 local_4b40 [64];
  undefined1 local_4b00 [64];
  undefined1 local_4ac0 [64];
  undefined1 local_4a80 [64];
  undefined1 local_4a40 [64];
  undefined1 local_4a00 [64];
  undefined1 local_49c0 [64];
  undefined1 local_4980 [64];
  undefined1 local_4940 [64];
  undefined1 local_4900 [64];
  undefined1 local_48c0 [64];
  undefined1 local_4880 [64];
  undefined1 local_4840 [64];
  undefined1 local_4800 [64];
  undefined1 local_47c0 [64];
  undefined1 local_4780 [64];
  undefined1 local_4740 [64];
  undefined1 local_4700 [64];
  undefined1 local_46c0 [64];
  undefined1 local_4680 [64];
  undefined1 local_4640 [64];
  undefined1 local_4600 [64];
  undefined1 local_45c0 [64];
  undefined1 local_4580 [64];
  undefined1 local_4540 [64];
  undefined1 local_4500 [64];
  undefined1 local_44c0 [64];
  undefined1 local_4480 [64];
  undefined1 local_4440 [64];
  undefined1 local_4400 [64];
  undefined1 local_43c0 [64];
  undefined1 local_4380 [64];
  undefined1 local_4340 [64];
  undefined1 local_4300 [64];
  undefined1 local_42c0 [64];
  undefined1 local_4280 [64];
  undefined1 local_4240 [64];
  undefined1 local_4200 [64];
  undefined1 local_41c0 [64];
  undefined1 local_4180 [64];
  undefined1 local_4140 [64];
  undefined1 local_4100 [64];
  undefined1 local_40c0 [64];
  undefined1 local_4080 [64];
  undefined1 local_4040 [64];
  undefined1 local_4000 [64];
  undefined1 local_3fc0 [64];
  undefined1 local_3f80 [64];
  undefined1 local_3f40 [64];
  undefined1 local_3f00 [64];
  undefined1 local_3ec0 [64];
  undefined1 local_3e80 [64];
  undefined1 local_3e40 [64];
  undefined1 local_3e00 [64];
  undefined1 local_3dc0 [64];
  undefined1 local_3d80 [64];
  undefined1 local_3d40 [64];
  undefined1 local_3d00 [64];
  undefined1 local_3cc0 [64];
  undefined1 local_3c80 [64];
  undefined1 local_3c40 [64];
  undefined1 local_3c00 [64];
  undefined1 local_3bc0 [64];
  undefined1 local_3b80 [64];
  undefined1 local_3b40 [64];
  undefined1 local_3b00 [64];
  undefined1 local_3ac0 [64];
  undefined1 local_3a80 [64];
  undefined1 local_3a40 [64];
  undefined1 local_3a00 [64];
  undefined1 local_39c0 [64];
  undefined1 local_3980 [64];
  undefined1 local_3940 [64];
  undefined1 local_3900 [64];
  undefined1 local_38c0 [64];
  undefined1 local_3880 [64];
  undefined1 local_3840 [64];
  undefined1 local_3800 [64];
  undefined1 local_37c0 [64];
  undefined1 local_3780 [64];
  undefined1 local_3740 [64];
  undefined1 local_3700 [64];
  undefined1 local_36c0 [64];
  undefined1 local_3680 [64];
  undefined1 local_3640 [64];
  undefined1 local_3600 [64];
  undefined1 local_35c0 [64];
  undefined1 local_3580 [64];
  undefined1 local_3540 [64];
  undefined1 local_3500 [64];
  undefined1 local_34c0 [64];
  undefined1 local_3480 [64];
  undefined1 local_3440 [64];
  undefined1 local_3400 [64];
  undefined1 local_33c0 [64];
  undefined1 local_3380 [64];
  undefined1 local_3340 [64];
  undefined1 local_3300 [64];
  undefined1 local_32c0 [64];
  undefined1 local_3280 [64];
  undefined1 local_3240 [64];
  undefined1 local_3200 [64];
  undefined1 local_31c0 [64];
  undefined1 local_3180 [64];
  undefined1 local_3140 [64];
  undefined1 local_3100 [64];
  undefined1 local_30c0 [64];
  undefined1 local_3080 [64];
  undefined1 local_3040 [64];
  undefined1 local_3000 [64];
  undefined1 local_2fc0 [64];
  undefined1 local_2f80 [64];
  undefined1 local_2f40 [64];
  undefined1 local_2f00 [64];
  undefined1 local_2ec0 [64];
  undefined1 local_2e80 [64];
  undefined1 local_2e40 [64];
  undefined1 local_2e00 [64];
  undefined1 local_2dc0 [64];
  undefined1 local_2d80 [64];
  undefined1 local_2d40 [64];
  undefined1 local_2d00 [64];
  undefined1 local_2cc0 [64];
  undefined1 local_2c80 [64];
  undefined1 local_2c40 [64];
  undefined1 local_2c00 [64];
  undefined1 local_2bc0 [64];
  undefined1 local_2b80 [64];
  undefined1 local_2b40 [64];
  undefined1 local_2b00 [64];
  undefined1 local_2ac0 [64];
  undefined1 local_2a80 [64];
  undefined1 local_2a40 [64];
  undefined1 local_2a00 [64];
  undefined1 local_29c0 [64];
  undefined1 local_2980 [64];
  undefined1 local_2940 [64];
  undefined1 local_2900 [64];
  undefined1 local_28c0 [64];
  undefined1 local_2880 [64];
  undefined1 local_2840 [64];
  undefined1 local_2800 [64];
  undefined1 local_27c0 [64];
  undefined1 local_2780 [64];
  undefined1 local_2740 [64];
  undefined1 local_2700 [64];
  undefined1 local_26c0 [64];
  undefined1 local_2680 [64];
  undefined1 local_2640 [64];
  undefined1 local_2600 [64];
  undefined1 local_25c0 [64];
  undefined1 local_2580 [64];
  undefined1 local_2540 [64];
  undefined1 local_2500 [64];
  undefined1 local_24c0 [64];
  undefined1 local_2480 [64];
  undefined1 local_2440 [64];
  undefined1 local_2400 [64];
  undefined1 local_23c0 [64];
  undefined1 local_2380 [64];
  undefined1 local_2340 [64];
  undefined1 local_2300 [64];
  undefined1 local_22c0 [64];
  undefined1 local_2280 [64];
  undefined1 local_2240 [64];
  undefined1 local_2200 [64];
  undefined1 local_21c0 [64];
  undefined1 local_2180 [64];
  undefined1 local_2140 [64];
  undefined1 local_2100 [64];
  undefined1 local_20c0 [64];
  undefined1 local_2080 [64];
  undefined1 local_2040 [64];
  undefined1 local_2000 [64];
  undefined1 local_1fc0 [64];
  undefined1 local_1f80 [64];
  undefined1 local_1f40 [64];
  undefined1 local_1f00 [64];
  undefined1 local_1ec0 [64];
  undefined1 local_1e80 [64];
  undefined1 local_1e40 [64];
  undefined1 local_1e00 [64];
  undefined1 local_1dc0 [64];
  undefined1 local_1d80 [64];
  undefined1 local_1d40 [64];
  undefined1 local_1d00 [64];
  undefined1 local_1cc0 [64];
  undefined1 local_1c80 [64];
  undefined1 local_1c40 [64];
  undefined1 local_1c00 [64];
  undefined1 local_1bc0 [64];
  undefined1 local_1b80 [64];
  undefined1 local_1b40 [64];
  undefined1 local_1b00 [64];
  undefined1 local_1ac0 [64];
  undefined1 local_1a80 [64];
  undefined1 local_1a40 [64];
  undefined1 local_1a00 [64];
  undefined1 local_19c0 [64];
  undefined1 local_1980 [64];
  undefined1 local_1940 [64];
  undefined1 local_1900 [64];
  undefined1 local_18c0 [64];
  undefined1 local_1880 [128];
  undefined1 local_1800 [64];
  undefined1 local_17c0 [64];
  undefined1 local_1780 [64];
  undefined1 local_1740 [64];
  undefined1 local_1700 [64];
  undefined1 local_16c0 [64];
  undefined1 local_1680 [64];
  undefined1 local_1640 [64];
  undefined1 local_1600 [64];
  undefined1 local_15c0 [64];
  undefined1 local_1580 [64];
  undefined1 local_1540 [64];
  undefined1 local_1500 [64];
  undefined1 local_14c0 [64];
  undefined1 local_1480 [64];
  undefined1 local_1440 [64];
  undefined1 local_1400 [64];
  undefined1 local_13c0 [64];
  undefined1 local_1380 [64];
  undefined1 local_1340 [64];
  undefined1 local_1300 [64];
  undefined1 local_12c0 [64];
  undefined1 local_1280 [64];
  undefined1 local_1240 [64];
  undefined1 local_1200 [64];
  undefined1 local_11c0 [64];
  undefined1 local_1180 [64];
  undefined1 local_1140 [64];
  undefined1 local_1100 [64];
  undefined1 local_10c0 [64];
  undefined1 local_1080 [64];
  undefined1 local_1040 [64];
  undefined1 local_1000 [64];
  undefined1 local_fc0 [64];
  undefined1 local_f80 [64];
  undefined1 local_f40 [64];
  undefined1 local_f00 [64];
  undefined1 local_ec0 [64];
  undefined1 local_e80 [64];
  undefined1 local_e40 [64];
  undefined1 local_e00 [64];
  undefined1 local_dc0 [64];
  undefined1 local_d80 [64];
  undefined1 local_d40 [64];
  undefined1 local_d00 [64];
  undefined1 local_cc0 [64];
  undefined1 local_c80 [64];
  undefined1 local_c40 [64];
  undefined1 local_c00 [64];
  undefined1 local_bc0 [64];
  undefined1 local_b80 [64];
  undefined1 local_b40 [64];
  undefined1 local_b00 [64];
  undefined1 local_ac0 [64];
  undefined1 local_a80 [64];
  undefined1 local_a40 [64];
  undefined1 local_a00 [64];
  undefined1 local_9c0 [64];
  undefined1 local_980 [64];
  undefined1 local_940 [64];
  undefined1 local_900 [64];
  undefined1 local_8c0 [64];
  undefined1 local_880 [64];
  undefined1 local_840 [64];
  undefined1 local_800 [64];
  undefined1 local_7c0 [64];
  undefined1 local_780 [64];
  undefined1 local_740 [64];
  undefined1 local_700 [64];
  undefined1 local_6c0 [64];
  Matrix<double,_32,_3,_1,_32,_3> local_680;
  Matrix3xN local_380;
  
  CalcCoordMatrix(this,&local_380);
  if ((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows
      != 0x20) {
    pcVar52 = 
    "Eigen::Product<Eigen::Transpose<Eigen::Matrix<double, -1, -1, 1>>, Eigen::Transpose<Eigen::Matrix<double, 3, 32, 1>>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Transpose<Eigen::Matrix<double, -1, -1, 1>>, Rhs = Eigen::Transpose<Eigen::Matrix<double, 3, 32, 1>>, Option = 0]"
    ;
LAB_00705640:
    __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                  ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,pcVar52);
  }
  local_1880._8_8_ = &local_380;
  local_1880._0_8_ = &this->m_SD;
  if ((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols
      == 0xc0) {
    memset((Matrix<double,_192,_3,_0,_192,_3> *)local_4280,0,0x1200);
    local_680.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_1,_32,_3>_>.m_storage.m_data.array
    [0] = 1.0;
    Eigen::internal::
    generic_product_impl<Eigen::Transpose<Eigen::Matrix<double,-1,-1,1,-1,-1>>,Eigen::Transpose<Eigen::Matrix<double,3,32,1,3,32>>,Eigen::DenseShape,Eigen::DenseShape,8>
    ::scaleAndAddTo<Eigen::Matrix<double,192,3,0,192,3>>
              ((Matrix<double,_192,_3,_0,_192,_3> *)local_4280,
               (Transpose<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)local_1880,
               (Transpose<Eigen::Matrix<double,_3,_32,_1,_3,_32>_> *)(local_1880 + 8),
               (Scalar *)&local_680);
    auVar53 = vmulpd_avx512f(local_4280,local_4280);
    auVar54 = vmulpd_avx512f(local_3c80,local_3c80);
    auVar53 = vaddpd_avx512f(auVar53,auVar54);
    auVar54 = vmulpd_avx512f(local_3680,local_3680);
    auVar53 = vaddpd_avx512f(auVar53,auVar54);
    auVar54 = vmulpd_avx512f(local_4240,local_4240);
    auVar55 = vmulpd_avx512f(local_3c40,local_3c40);
    auVar54 = vaddpd_avx512f(auVar54,auVar55);
    auVar55 = vmulpd_avx512f(local_3640,local_3640);
    auVar54 = vaddpd_avx512f(auVar54,auVar55);
    auVar55 = vmulpd_avx512f(local_4200,local_4200);
    auVar56 = vmulpd_avx512f(local_3c00,local_3c00);
    auVar55 = vaddpd_avx512f(auVar55,auVar56);
    auVar56 = vmulpd_avx512f(local_3600,local_3600);
    auVar55 = vaddpd_avx512f(auVar55,auVar56);
    auVar56 = vmulpd_avx512f(local_41c0,local_41c0);
    auVar57 = vmulpd_avx512f(local_3bc0,local_3bc0);
    auVar56 = vaddpd_avx512f(auVar56,auVar57);
    auVar57 = vmulpd_avx512f(local_35c0,local_35c0);
    auVar56 = vaddpd_avx512f(auVar56,auVar57);
    auVar57 = vmulpd_avx512f(local_4180,local_4180);
    auVar58 = vmulpd_avx512f(local_3b80,local_3b80);
    auVar57 = vaddpd_avx512f(auVar57,auVar58);
    auVar58 = vmulpd_avx512f(local_3580,local_3580);
    auVar57 = vaddpd_avx512f(auVar57,auVar58);
    auVar58 = vmulpd_avx512f(local_4140,local_4140);
    auVar59 = vmulpd_avx512f(local_3b40,local_3b40);
    auVar58 = vaddpd_avx512f(auVar58,auVar59);
    auVar59 = vmulpd_avx512f(local_3540,local_3540);
    auVar58 = vaddpd_avx512f(auVar58,auVar59);
    auVar59 = vmulpd_avx512f(local_4100,local_4100);
    local_44c0 = local_3b00;
    auVar60 = vmulpd_avx512f(local_3b00,local_3b00);
    auVar59 = vaddpd_avx512f(auVar59,auVar60);
    local_4500 = local_3500;
    auVar60 = vmulpd_avx512f(local_3500,local_3500);
    auVar59 = vaddpd_avx512f(auVar59,auVar60);
    local_4540 = local_40c0;
    auVar60 = vmulpd_avx512f(local_40c0,local_40c0);
    local_4580 = local_3ac0;
    auVar61 = vmulpd_avx512f(local_3ac0,local_3ac0);
    auVar60 = vaddpd_avx512f(auVar60,auVar61);
    local_45c0 = local_34c0;
    auVar61 = vmulpd_avx512f(local_34c0,local_34c0);
    auVar60 = vaddpd_avx512f(auVar60,auVar61);
    auVar61 = vbroadcastsd_avx512f(ZEXT816(0xbff0000000000000));
    local_4480 = vaddpd_avx512f(auVar53,auVar61);
    local_4440 = vaddpd_avx512f(auVar54,auVar61);
    local_4400 = vaddpd_avx512f(auVar55,auVar61);
    local_43c0 = vaddpd_avx512f(auVar56,auVar61);
    local_4380 = vaddpd_avx512f(auVar57,auVar61);
    local_4340 = vaddpd_avx512f(auVar58,auVar61);
    local_4300 = vaddpd_avx512f(auVar59,auVar61);
    local_42c0 = vaddpd_avx512f(auVar60,auVar61);
    uVar48 = (this->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_rows;
    uVar38 = (this->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_cols;
    if ((long)(uVar38 | uVar48) < 0) {
      __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                    ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Array<double, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Array<double, -1, -1>]"
                   );
    }
    local_4a80 = local_4100;
    local_4a40 = local_3540;
    local_4a00 = local_3b40;
    local_49c0 = local_4140;
    local_4980 = local_3580;
    local_4940 = local_3b80;
    local_4900 = local_4180;
    local_48c0 = local_35c0;
    local_4880 = local_3bc0;
    local_4840 = local_3600;
    local_4800 = local_3c00;
    local_47c0 = local_3640;
    local_4780 = local_3c40;
    local_4740 = local_3680;
    local_4700 = local_3c80;
    local_46c0 = local_4280;
    local_4680 = local_4240;
    local_4640 = local_4200;
    local_4600 = local_41c0;
    if ((uVar48 == 0x40) && (uVar38 == 1)) {
      pauVar39 = (undefined1 (*) [64])
                 (this->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data;
      local_4ac0 = *pauVar39;
      auVar53 = vbroadcastsd_avx512f(ZEXT816(0x3fe0000000000000));
      local_2400 = vmulpd_avx512f(local_4ac0,auVar53);
      local_4480 = vmulpd_avx512f(local_4480,local_2400);
      local_4b00 = pauVar39[1];
      local_2340 = vmulpd_avx512f(local_4b00,auVar53);
      local_4440 = vmulpd_avx512f(local_4440,local_2340);
      local_4b40 = pauVar39[2];
      local_2380 = vmulpd_avx512f(local_4b40,auVar53);
      local_4400 = vmulpd_avx512f(local_4400,local_2380);
      local_4b80 = pauVar39[3];
      local_23c0 = vmulpd_avx512f(local_4b80,auVar53);
      local_43c0 = vmulpd_avx512f(local_43c0,local_23c0);
      local_4bc0 = pauVar39[4];
      local_2440 = vmulpd_avx512f(local_4bc0,auVar53);
      local_4380 = vmulpd_avx512f(local_4380,local_2440);
      local_4c00 = pauVar39[5];
      local_2480 = vmulpd_avx512f(local_4c00,auVar53);
      local_4340 = vmulpd_avx512f(local_4340,local_2480);
      local_22c0 = pauVar39[6];
      local_24c0 = vmulpd_avx512f(local_22c0,auVar53);
      local_4300 = vmulpd_avx512f(local_4300,local_24c0);
      local_2300 = pauVar39[7];
      local_2500 = vmulpd_avx512f(local_2300,auVar53);
      local_42c0 = vmulpd_avx512f(local_42c0,local_2500);
      local_50c0 = local_4080;
      auVar53 = vmulpd_avx512f(local_4080,local_4080);
      local_5100 = local_3a80;
      auVar54 = vmulpd_avx512f(local_3a80,local_3a80);
      auVar53 = vaddpd_avx512f(auVar53,auVar54);
      local_5140 = local_3480;
      auVar54 = vmulpd_avx512f(local_3480,local_3480);
      auVar53 = vaddpd_avx512f(auVar53,auVar54);
      local_5180 = local_4040;
      auVar54 = vmulpd_avx512f(local_4040,local_4040);
      local_5040 = local_3a40;
      auVar55 = vmulpd_avx512f(local_3a40,local_3a40);
      auVar54 = vaddpd_avx512f(auVar54,auVar55);
      local_5080 = local_3440;
      auVar55 = vmulpd_avx512f(local_3440,local_3440);
      auVar54 = vaddpd_avx512f(auVar54,auVar55);
      local_5240 = local_4000;
      auVar55 = vmulpd_avx512f(local_4000,local_4000);
      local_5280 = local_3a00;
      auVar56 = vmulpd_avx512f(local_3a00,local_3a00);
      auVar55 = vaddpd_avx512f(auVar55,auVar56);
      local_52c0 = local_3400;
      auVar56 = vmulpd_avx512f(local_3400,local_3400);
      auVar55 = vaddpd_avx512f(auVar55,auVar56);
      local_5300 = local_3fc0;
      auVar56 = vmulpd_avx512f(local_3fc0,local_3fc0);
      local_51c0 = local_39c0;
      auVar57 = vmulpd_avx512f(local_39c0,local_39c0);
      auVar56 = vaddpd_avx512f(auVar56,auVar57);
      local_5200 = local_33c0;
      auVar57 = vmulpd_avx512f(local_33c0,local_33c0);
      auVar56 = vaddpd_avx512f(auVar56,auVar57);
      local_53c0 = local_3f80;
      auVar57 = vmulpd_avx512f(local_3f80,local_3f80);
      local_5400 = local_3980;
      auVar58 = vmulpd_avx512f(local_3980,local_3980);
      auVar57 = vaddpd_avx512f(auVar57,auVar58);
      local_5440 = local_3380;
      auVar58 = vmulpd_avx512f(local_3380,local_3380);
      auVar57 = vaddpd_avx512f(auVar57,auVar58);
      local_5480 = local_3f40;
      auVar58 = vmulpd_avx512f(local_3f40,local_3f40);
      local_5340 = local_3940;
      auVar59 = vmulpd_avx512f(local_3940,local_3940);
      auVar58 = vaddpd_avx512f(auVar58,auVar59);
      local_5380 = local_3340;
      auVar59 = vmulpd_avx512f(local_3340,local_3340);
      auVar58 = vaddpd_avx512f(auVar58,auVar59);
      local_5540 = local_3f00;
      auVar59 = vmulpd_avx512f(local_3f00,local_3f00);
      local_5580 = local_3900;
      auVar60 = vmulpd_avx512f(local_3900,local_3900);
      auVar59 = vaddpd_avx512f(auVar59,auVar60);
      local_55c0 = local_3300;
      auVar60 = vmulpd_avx512f(local_3300,local_3300);
      auVar59 = vaddpd_avx512f(auVar59,auVar60);
      local_5600 = local_3ec0;
      auVar60 = vmulpd_avx512f(local_3ec0,local_3ec0);
      local_54c0 = local_38c0;
      auVar62 = vmulpd_avx512f(local_38c0,local_38c0);
      auVar60 = vaddpd_avx512f(auVar60,auVar62);
      local_5500 = local_32c0;
      auVar62 = vmulpd_avx512f(local_32c0,local_32c0);
      auVar60 = vaddpd_avx512f(auVar60,auVar62);
      auVar53 = vaddpd_avx512f(auVar53,auVar61);
      auVar54 = vaddpd_avx512f(auVar54,auVar61);
      auVar55 = vaddpd_avx512f(auVar55,auVar61);
      local_2c80 = vmulpd_avx512f(local_2400,auVar53);
      local_2c40 = vmulpd_avx512f(local_2340,auVar54);
      local_2c00 = vmulpd_avx512f(local_2380,auVar55);
      auVar53 = vaddpd_avx512f(auVar56,auVar61);
      local_2bc0 = vmulpd_avx512f(local_23c0,auVar53);
      auVar53 = vaddpd_avx512f(auVar57,auVar61);
      local_2b80 = vmulpd_avx512f(local_2440,auVar53);
      auVar53 = vaddpd_avx512f(auVar58,auVar61);
      local_2b40 = vmulpd_avx512f(local_2480,auVar53);
      auVar53 = vaddpd_avx512f(auVar59,auVar61);
      local_2b00 = vmulpd_avx512f(local_24c0,auVar53);
      auVar53 = vaddpd_avx512f(auVar60,auVar61);
      local_2ac0 = vmulpd_avx512f(local_2500,auVar53);
      local_2540 = local_3e80;
      auVar53 = vmulpd_avx512f(local_3e80,local_3e80);
      auVar54 = vmulpd_avx512f(local_3880,local_3880);
      auVar53 = vaddpd_avx512f(auVar53,auVar54);
      auVar54 = vmulpd_avx512f(local_3280,local_3280);
      local_2680 = local_3280;
      auVar53 = vaddpd_avx512f(auVar53,auVar54);
      local_2580 = local_3e40;
      auVar54 = vmulpd_avx512f(local_3e40,local_3e40);
      auVar55 = vmulpd_avx512f(local_3840,local_3840);
      auVar54 = vaddpd_avx512f(auVar54,auVar55);
      auVar55 = vmulpd_avx512f(local_3240,local_3240);
      local_2800 = local_3240;
      auVar54 = vaddpd_avx512f(auVar54,auVar55);
      local_25c0 = local_3e00;
      auVar55 = vmulpd_avx512f(local_3e00,local_3e00);
      auVar56 = vmulpd_avx512f(local_3800,local_3800);
      auVar55 = vaddpd_avx512f(auVar55,auVar56);
      auVar56 = vmulpd_avx512f(local_3200,local_3200);
      local_26c0 = local_3200;
      auVar55 = vaddpd_avx512f(auVar55,auVar56);
      auVar56 = vmulpd_avx512f(local_3dc0,local_3dc0);
      auVar57 = vmulpd_avx512f(local_37c0,local_37c0);
      auVar56 = vaddpd_avx512f(auVar56,auVar57);
      auVar57 = vmulpd_avx512f(local_31c0,local_31c0);
      auVar56 = vaddpd_avx512f(auVar56,auVar57);
      local_2600 = local_3d80;
      auVar57 = vmulpd_avx512f(local_3d80,local_3d80);
      auVar58 = vmulpd_avx512f(local_3780,local_3780);
      auVar57 = vaddpd_avx512f(auVar57,auVar58);
      auVar58 = vmulpd_avx512f(local_3180,local_3180);
      auVar57 = vaddpd_avx512f(auVar57,auVar58);
      local_2640 = local_3d40;
      auVar58 = vmulpd_avx512f(local_3d40,local_3d40);
      auVar59 = vmulpd_avx512f(local_3740,local_3740);
      auVar58 = vaddpd_avx512f(auVar58,auVar59);
      auVar59 = vmulpd_avx512f(local_3140,local_3140);
      auVar58 = vaddpd_avx512f(auVar58,auVar59);
      auVar59 = vmulpd_avx512f(local_3d00,local_3d00);
      local_2700 = local_3d00;
      auVar60 = vmulpd_avx512f(local_3700,local_3700);
      local_2740 = local_3700;
      auVar59 = vaddpd_avx512f(auVar59,auVar60);
      auVar60 = vmulpd_avx512f(local_3100,local_3100);
      local_2780 = local_3100;
      auVar59 = vaddpd_avx512f(auVar59,auVar60);
      auVar60 = vmulpd_avx512f(local_3cc0,local_3cc0);
      local_27c0 = local_3cc0;
      auVar62 = vmulpd_avx512f(local_36c0,local_36c0);
      local_2840 = local_36c0;
      auVar60 = vaddpd_avx512f(auVar60,auVar62);
      auVar62 = vmulpd_avx512f(local_30c0,local_30c0);
      local_2880 = local_30c0;
      auVar60 = vaddpd_avx512f(auVar60,auVar62);
      auVar53 = vaddpd_avx512f(auVar53,auVar61);
      auVar54 = vaddpd_avx512f(auVar54,auVar61);
      auVar55 = vaddpd_avx512f(auVar55,auVar61);
      auVar56 = vaddpd_avx512f(auVar56,auVar61);
      auVar57 = vaddpd_avx512f(auVar57,auVar61);
      auVar58 = vaddpd_avx512f(auVar58,auVar61);
      auVar59 = vaddpd_avx512f(auVar59,auVar61);
      auVar60 = vaddpd_avx512f(auVar60,auVar61);
      local_2e80 = vmulpd_avx512f(auVar53,local_2400);
      local_2e40 = vmulpd_avx512f(auVar54,local_2340);
      local_2e00 = vmulpd_avx512f(auVar55,local_2380);
      local_2dc0 = vmulpd_avx512f(auVar56,local_23c0);
      local_2d80 = vmulpd_avx512f(auVar57,local_2440);
      local_2d40 = vmulpd_avx512f(auVar58,local_2480);
      local_2d00 = vmulpd_avx512f(auVar59,local_24c0);
      local_2cc0 = vmulpd_avx512f(auVar60,local_2500);
      auVar53 = vmulpd_avx512f(local_3e80,local_4080);
      auVar54 = vmulpd_avx512f(local_3880,local_3a80);
      auVar53 = vaddpd_avx512f(auVar53,auVar54);
      auVar54 = vmulpd_avx512f(local_3280,local_3480);
      auVar53 = vaddpd_avx512f(auVar53,auVar54);
      auVar54 = vmulpd_avx512f(local_3e40,local_4040);
      auVar55 = vmulpd_avx512f(local_3840,local_3a40);
      auVar54 = vaddpd_avx512f(auVar54,auVar55);
      auVar55 = vmulpd_avx512f(local_3240,local_3440);
      auVar54 = vaddpd_avx512f(auVar54,auVar55);
      auVar55 = vmulpd_avx512f(local_3e00,local_4000);
      auVar56 = vmulpd_avx512f(local_3800,local_3a00);
      auVar55 = vaddpd_avx512f(auVar55,auVar56);
      auVar56 = vmulpd_avx512f(local_3200,local_3400);
      auVar55 = vaddpd_avx512f(auVar55,auVar56);
      auVar56 = vmulpd_avx512f(local_3dc0,local_3fc0);
      auVar57 = vmulpd_avx512f(local_37c0,local_39c0);
      auVar56 = vaddpd_avx512f(auVar56,auVar57);
      auVar57 = vmulpd_avx512f(local_31c0,local_33c0);
      auVar56 = vaddpd_avx512f(auVar56,auVar57);
      auVar57 = vmulpd_avx512f(local_3d80,local_3f80);
      auVar58 = vmulpd_avx512f(local_3780,local_3980);
      auVar57 = vaddpd_avx512f(auVar57,auVar58);
      auVar58 = vmulpd_avx512f(local_3180,local_3380);
      auVar57 = vaddpd_avx512f(auVar57,auVar58);
      auVar58 = vmulpd_avx512f(local_3d40,local_3f40);
      auVar59 = vmulpd_avx512f(local_3740,local_3940);
      auVar58 = vaddpd_avx512f(auVar58,auVar59);
      auVar59 = vmulpd_avx512f(local_3140,local_3340);
      auVar58 = vaddpd_avx512f(auVar58,auVar59);
      auVar59 = vmulpd_avx512f(local_3d00,local_3f00);
      auVar60 = vmulpd_avx512f(local_3700,local_3900);
      auVar59 = vaddpd_avx512f(auVar59,auVar60);
      auVar60 = vmulpd_avx512f(local_3100,local_3300);
      auVar59 = vaddpd_avx512f(auVar59,auVar60);
      auVar60 = vmulpd_avx512f(local_3cc0,local_3ec0);
      auVar61 = vmulpd_avx512f(local_36c0,local_38c0);
      auVar60 = vaddpd_avx512f(auVar60,auVar61);
      auVar61 = vmulpd_avx512f(local_30c0,local_32c0);
      auVar60 = vaddpd_avx512f(auVar60,auVar61);
      local_2080 = vmulpd_avx512f(local_4ac0,auVar53);
      local_2040 = vmulpd_avx512f(local_4b00,auVar54);
      local_2000 = vmulpd_avx512f(local_4b40,auVar55);
      local_1fc0 = vmulpd_avx512f(local_4b80,auVar56);
      local_1f80 = vmulpd_avx512f(local_4bc0,auVar57);
      local_1f40 = vmulpd_avx512f(local_4c00,auVar58);
      local_1f00 = vmulpd_avx512f(local_22c0,auVar59);
      local_1ec0 = vmulpd_avx512f(local_2300,auVar60);
      auVar53 = vmulpd_avx512f(local_3e80,local_4280);
      auVar54 = vmulpd_avx512f(local_3880,local_3c80);
      auVar53 = vaddpd_avx512f(auVar53,auVar54);
      auVar54 = vmulpd_avx512f(local_3280,local_3680);
      auVar53 = vaddpd_avx512f(auVar53,auVar54);
      auVar54 = vmulpd_avx512f(local_3e40,local_4240);
      auVar55 = vmulpd_avx512f(local_3840,local_3c40);
      auVar54 = vaddpd_avx512f(auVar54,auVar55);
      auVar55 = vmulpd_avx512f(local_3240,local_3640);
      auVar54 = vaddpd_avx512f(auVar54,auVar55);
      auVar55 = vmulpd_avx512f(local_3e00,local_4200);
      auVar56 = vmulpd_avx512f(local_3800,local_3c00);
      auVar55 = vaddpd_avx512f(auVar55,auVar56);
      auVar56 = vmulpd_avx512f(local_3200,local_3600);
      auVar55 = vaddpd_avx512f(auVar55,auVar56);
      auVar56 = vmulpd_avx512f(local_3dc0,local_41c0);
      auVar57 = vmulpd_avx512f(local_37c0,local_3bc0);
      auVar56 = vaddpd_avx512f(auVar56,auVar57);
      auVar57 = vmulpd_avx512f(local_31c0,local_35c0);
      auVar56 = vaddpd_avx512f(auVar56,auVar57);
      auVar57 = vmulpd_avx512f(local_3d80,local_4180);
      auVar58 = vmulpd_avx512f(local_3780,local_3b80);
      auVar57 = vaddpd_avx512f(auVar57,auVar58);
      auVar58 = vmulpd_avx512f(local_3180,local_3580);
      auVar57 = vaddpd_avx512f(auVar57,auVar58);
      auVar58 = vmulpd_avx512f(local_3d40,local_4140);
      auVar59 = vmulpd_avx512f(local_3740,local_3b40);
      auVar58 = vaddpd_avx512f(auVar58,auVar59);
      auVar59 = vmulpd_avx512f(local_3140,local_3540);
      auVar58 = vaddpd_avx512f(auVar58,auVar59);
      auVar59 = vmulpd_avx512f(local_3d00,local_4100);
      auVar60 = vmulpd_avx512f(local_3700,local_3b00);
      auVar59 = vaddpd_avx512f(auVar59,auVar60);
      auVar60 = vmulpd_avx512f(local_3100,local_3500);
      auVar59 = vaddpd_avx512f(auVar59,auVar60);
      auVar60 = vmulpd_avx512f(local_3cc0,local_40c0);
      auVar61 = vmulpd_avx512f(local_36c0,local_3ac0);
      auVar60 = vaddpd_avx512f(auVar60,auVar61);
      auVar61 = vmulpd_avx512f(local_30c0,local_34c0);
      auVar60 = vaddpd_avx512f(auVar60,auVar61);
      local_2280 = vmulpd_avx512f(local_4ac0,auVar53);
      local_2240 = vmulpd_avx512f(local_4b00,auVar54);
      local_2200 = vmulpd_avx512f(local_4b40,auVar55);
      local_21c0 = vmulpd_avx512f(local_4b80,auVar56);
      local_2180 = vmulpd_avx512f(local_4bc0,auVar57);
      local_2140 = vmulpd_avx512f(local_4c00,auVar58);
      local_2100 = vmulpd_avx512f(local_22c0,auVar59);
      local_20c0 = vmulpd_avx512f(local_2300,auVar60);
      auVar53 = vmulpd_avx512f(local_4080,local_4280);
      auVar54 = vmulpd_avx512f(local_3a80,local_3c80);
      auVar53 = vaddpd_avx512f(auVar53,auVar54);
      auVar54 = vmulpd_avx512f(local_3480,local_3680);
      local_2a80 = vaddpd_avx512f(auVar53,auVar54);
      auVar53 = vmulpd_avx512f(local_4040,local_4240);
      auVar54 = vmulpd_avx512f(local_3a40,local_3c40);
      auVar53 = vaddpd_avx512f(auVar53,auVar54);
      auVar54 = vmulpd_avx512f(local_3440,local_3640);
      local_2a40 = vaddpd_avx512f(auVar53,auVar54);
      auVar53 = vmulpd_avx512f(local_4000,local_4200);
      auVar54 = vmulpd_avx512f(local_3a00,local_3c00);
      auVar53 = vaddpd_avx512f(auVar53,auVar54);
      auVar54 = vmulpd_avx512f(local_3400,local_3600);
      local_2a00 = vaddpd_avx512f(auVar53,auVar54);
      auVar53 = vmulpd_avx512f(local_3fc0,local_41c0);
      auVar54 = vmulpd_avx512f(local_39c0,local_3bc0);
      auVar53 = vaddpd_avx512f(auVar53,auVar54);
      auVar54 = vmulpd_avx512f(local_33c0,local_35c0);
      local_29c0 = vaddpd_avx512f(auVar53,auVar54);
      auVar53 = vmulpd_avx512f(local_3f80,local_4180);
      auVar54 = vmulpd_avx512f(local_3980,local_3b80);
      auVar53 = vaddpd_avx512f(auVar53,auVar54);
      auVar54 = vmulpd_avx512f(local_3380,local_3580);
      local_2980 = vaddpd_avx512f(auVar53,auVar54);
      auVar53 = vmulpd_avx512f(local_3f40,local_4140);
      auVar54 = vmulpd_avx512f(local_3940,local_3b40);
      auVar53 = vaddpd_avx512f(auVar53,auVar54);
      auVar54 = vmulpd_avx512f(local_3340,local_3540);
      local_2940 = vaddpd_avx512f(auVar53,auVar54);
      auVar53 = vmulpd_avx512f(local_3f00,local_4100);
      auVar54 = vmulpd_avx512f(local_3900,local_3b00);
      auVar53 = vaddpd_avx512f(auVar53,auVar54);
      auVar54 = vmulpd_avx512f(local_3300,local_3500);
      local_2900 = vaddpd_avx512f(auVar53,auVar54);
      auVar53 = vmulpd_avx512f(local_3ec0,local_40c0);
      auVar54 = vmulpd_avx512f(local_38c0,local_3ac0);
      auVar53 = vaddpd_avx512f(auVar53,auVar54);
      auVar54 = vmulpd_avx512f(local_32c0,local_34c0);
      local_28c0 = vaddpd_avx512f(auVar53,auVar54);
      if (((this->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_rows == 0x40) &&
         ((this->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_cols == 1)) {
        pauVar39 = (undefined1 (*) [64])
                   (this->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_data;
        local_2a80 = vmulpd_avx512f(local_2a80,*pauVar39);
        local_2a40 = vmulpd_avx512f(local_2a40,pauVar39[1]);
        local_2a00 = vmulpd_avx512f(local_2a00,pauVar39[2]);
        local_29c0 = vmulpd_avx512f(local_29c0,pauVar39[3]);
        local_2980 = vmulpd_avx512f(local_2980,pauVar39[4]);
        local_2940 = vmulpd_avx512f(local_2940,pauVar39[5]);
        local_2900 = vmulpd_avx512f(local_2900,pauVar39[6]);
        local_28c0 = vmulpd_avx512f(local_28c0,pauVar39[7]);
        peVar40 = (this->m_material).
                  super___shared_ptr<chrono::fea::ChMaterialHexaANCF,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr;
        this_00 = (this->m_material).
                  super___shared_ptr<chrono::fea::ChMaterialHexaANCF,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_00->_M_use_count = this_00->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this_00->_M_use_count = this_00->_M_use_count + 1;
          }
        }
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
        auVar2._8_8_ = 0;
        auVar2._0_8_ = (peVar40->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                       m_storage.m_data.array[0];
        auVar53 = vbroadcastsd_avx512f(auVar2);
        auVar3._8_8_ = 0;
        auVar3._0_8_ = *(double *)
                        ((long)(peVar40->m_D).
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                               m_storage.m_data.array + 8);
        auVar54 = vbroadcastsd_avx512f(auVar3);
        auVar4._8_8_ = 0;
        auVar4._0_8_ = *(double *)
                        ((long)(peVar40->m_D).
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                               m_storage.m_data.array + 0x10);
        auVar55 = vbroadcastsd_avx512f(auVar4);
        auVar5._8_8_ = 0;
        auVar5._0_8_ = *(double *)
                        ((long)(peVar40->m_D).
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                               m_storage.m_data.array + 0x18);
        auVar56 = vbroadcastsd_avx512f(auVar5);
        auVar6._8_8_ = 0;
        auVar6._0_8_ = *(double *)
                        ((long)(peVar40->m_D).
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                               m_storage.m_data.array + 0x20);
        auVar57 = vbroadcastsd_avx512f(auVar6);
        auVar7._8_8_ = 0;
        auVar7._0_8_ = *(double *)
                        ((long)(peVar40->m_D).
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                               m_storage.m_data.array + 0x28);
        auVar58 = vbroadcastsd_avx512f(auVar7);
        uVar48 = 0xfffffffffffffff8;
        do {
          auVar59 = vmulpd_avx512f(auVar53,*(undefined1 (*) [64])(local_4440 + uVar48 * 8));
          auVar60 = vmulpd_avx512f(auVar54,*(undefined1 (*) [64])(local_2c40 + uVar48 * 8));
          auVar59 = vaddpd_avx512f(auVar59,auVar60);
          auVar60 = vmulpd_avx512f(auVar55,*(undefined1 (*) [64])(local_2e40 + uVar48 * 8));
          auVar59 = vaddpd_avx512f(auVar59,auVar60);
          auVar60 = vmulpd_avx512f(auVar56,*(undefined1 (*) [64])(local_2040 + uVar48 * 8));
          auVar59 = vaddpd_avx512f(auVar59,auVar60);
          auVar60 = vmulpd_avx512f(auVar57,*(undefined1 (*) [64])(local_2240 + uVar48 * 8));
          auVar59 = vaddpd_avx512f(auVar59,auVar60);
          auVar60 = vmulpd_avx512f(auVar58,*(undefined1 (*) [64])(local_2a40 + uVar48 * 8));
          auVar59 = vaddpd_avx512f(auVar59,auVar60);
          *(undefined1 (*) [64])(local_1a40 + uVar48 * 8) = auVar59;
          uVar48 = uVar48 + 8;
        } while (uVar48 < 0x38);
        auVar8._8_8_ = 0;
        auVar8._0_8_ = *(double *)
                        ((long)(peVar40->m_D).
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                               m_storage.m_data.array + 0x30);
        auVar53 = vbroadcastsd_avx512f(auVar8);
        auVar9._8_8_ = 0;
        auVar9._0_8_ = *(double *)
                        ((long)(peVar40->m_D).
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                               m_storage.m_data.array + 0x38);
        auVar54 = vbroadcastsd_avx512f(auVar9);
        auVar10._8_8_ = 0;
        auVar10._0_8_ =
             *(double *)
              ((long)(peVar40->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x40);
        auVar55 = vbroadcastsd_avx512f(auVar10);
        auVar11._8_8_ = 0;
        auVar11._0_8_ =
             *(double *)
              ((long)(peVar40->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x48);
        auVar56 = vbroadcastsd_avx512f(auVar11);
        auVar12._8_8_ = 0;
        auVar12._0_8_ =
             *(double *)
              ((long)(peVar40->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x50);
        auVar57 = vbroadcastsd_avx512f(auVar12);
        auVar13._8_8_ = 0;
        auVar13._0_8_ =
             *(double *)
              ((long)(peVar40->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x58);
        auVar58 = vbroadcastsd_avx512f(auVar13);
        uVar48 = 0xfffffffffffffff8;
        do {
          auVar59 = vmulpd_avx512f(auVar53,*(undefined1 (*) [64])(local_4440 + uVar48 * 8));
          auVar60 = vmulpd_avx512f(auVar54,*(undefined1 (*) [64])(local_2c40 + uVar48 * 8));
          auVar59 = vaddpd_avx512f(auVar59,auVar60);
          auVar60 = vmulpd_avx512f(auVar55,*(undefined1 (*) [64])(local_2e40 + uVar48 * 8));
          auVar59 = vaddpd_avx512f(auVar59,auVar60);
          auVar60 = vmulpd_avx512f(auVar56,*(undefined1 (*) [64])(local_2040 + uVar48 * 8));
          auVar59 = vaddpd_avx512f(auVar59,auVar60);
          auVar60 = vmulpd_avx512f(auVar57,*(undefined1 (*) [64])(local_2240 + uVar48 * 8));
          auVar59 = vaddpd_avx512f(auVar59,auVar60);
          auVar60 = vmulpd_avx512f(auVar58,*(undefined1 (*) [64])(local_2a40 + uVar48 * 8));
          auVar59 = vaddpd_avx512f(auVar59,auVar60);
          *(undefined1 (*) [64])(local_1c40 + uVar48 * 8) = auVar59;
          uVar48 = uVar48 + 8;
        } while (uVar48 < 0x38);
        auVar14._8_8_ = 0;
        auVar14._0_8_ =
             *(double *)
              ((long)(peVar40->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x60);
        auVar53 = vbroadcastsd_avx512f(auVar14);
        auVar15._8_8_ = 0;
        auVar15._0_8_ =
             *(double *)
              ((long)(peVar40->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x68);
        auVar54 = vbroadcastsd_avx512f(auVar15);
        auVar16._8_8_ = 0;
        auVar16._0_8_ =
             *(double *)
              ((long)(peVar40->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x70);
        auVar55 = vbroadcastsd_avx512f(auVar16);
        auVar17._8_8_ = 0;
        auVar17._0_8_ =
             *(double *)
              ((long)(peVar40->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x78);
        auVar56 = vbroadcastsd_avx512f(auVar17);
        auVar18._8_8_ = 0;
        auVar18._0_8_ =
             *(double *)
              ((long)(peVar40->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x80);
        auVar57 = vbroadcastsd_avx512f(auVar18);
        auVar19._8_8_ = 0;
        auVar19._0_8_ =
             *(double *)
              ((long)(peVar40->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x88);
        auVar58 = vbroadcastsd_avx512f(auVar19);
        uVar48 = 0xfffffffffffffff8;
        do {
          auVar59 = vmulpd_avx512f(auVar53,*(undefined1 (*) [64])(local_4440 + uVar48 * 8));
          auVar60 = vmulpd_avx512f(auVar54,*(undefined1 (*) [64])(local_2c40 + uVar48 * 8));
          auVar59 = vaddpd_avx512f(auVar59,auVar60);
          auVar60 = vmulpd_avx512f(auVar55,*(undefined1 (*) [64])(local_2e40 + uVar48 * 8));
          auVar59 = vaddpd_avx512f(auVar59,auVar60);
          auVar60 = vmulpd_avx512f(auVar56,*(undefined1 (*) [64])(local_2040 + uVar48 * 8));
          auVar59 = vaddpd_avx512f(auVar59,auVar60);
          auVar60 = vmulpd_avx512f(auVar57,*(undefined1 (*) [64])(local_2240 + uVar48 * 8));
          auVar59 = vaddpd_avx512f(auVar59,auVar60);
          auVar60 = vmulpd_avx512f(auVar58,*(undefined1 (*) [64])(local_2a40 + uVar48 * 8));
          auVar59 = vaddpd_avx512f(auVar59,auVar60);
          *(undefined1 (*) [64])(local_3040 + uVar48 * 8) = auVar59;
          uVar48 = uVar48 + 8;
        } while (uVar48 < 0x38);
        auVar20._8_8_ = 0;
        auVar20._0_8_ =
             *(double *)
              ((long)(peVar40->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x90);
        auVar53 = vbroadcastsd_avx512f(auVar20);
        auVar21._8_8_ = 0;
        auVar21._0_8_ =
             *(double *)
              ((long)(peVar40->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x98);
        auVar54 = vbroadcastsd_avx512f(auVar21);
        auVar22._8_8_ = 0;
        auVar22._0_8_ =
             *(double *)
              ((long)(peVar40->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0xa0);
        auVar55 = vbroadcastsd_avx512f(auVar22);
        auVar23._8_8_ = 0;
        auVar23._0_8_ =
             *(double *)
              ((long)(peVar40->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0xa8);
        auVar56 = vbroadcastsd_avx512f(auVar23);
        auVar24._8_8_ = 0;
        auVar24._0_8_ =
             *(double *)
              ((long)(peVar40->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0xb0);
        auVar57 = vbroadcastsd_avx512f(auVar24);
        auVar25._8_8_ = 0;
        auVar25._0_8_ =
             *(double *)
              ((long)(peVar40->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0xb8);
        auVar58 = vbroadcastsd_avx512f(auVar25);
        uVar48 = 0xfffffffffffffff8;
        do {
          auVar59 = vmulpd_avx512f(auVar53,*(undefined1 (*) [64])(local_4440 + uVar48 * 8));
          auVar60 = vmulpd_avx512f(auVar54,*(undefined1 (*) [64])(local_2c40 + uVar48 * 8));
          auVar59 = vaddpd_avx512f(auVar59,auVar60);
          auVar60 = vmulpd_avx512f(auVar55,*(undefined1 (*) [64])(local_2e40 + uVar48 * 8));
          auVar59 = vaddpd_avx512f(auVar59,auVar60);
          auVar60 = vmulpd_avx512f(auVar56,*(undefined1 (*) [64])(local_2040 + uVar48 * 8));
          auVar59 = vaddpd_avx512f(auVar59,auVar60);
          auVar60 = vmulpd_avx512f(auVar57,*(undefined1 (*) [64])(local_2240 + uVar48 * 8));
          auVar59 = vaddpd_avx512f(auVar59,auVar60);
          auVar60 = vmulpd_avx512f(auVar58,*(undefined1 (*) [64])(local_2a40 + uVar48 * 8));
          auVar59 = vaddpd_avx512f(auVar59,auVar60);
          *(undefined1 (*) [64])(local_4fc0 + uVar48 * 8) = auVar59;
          uVar48 = uVar48 + 8;
        } while (uVar48 < 0x38);
        auVar26._8_8_ = 0;
        auVar26._0_8_ =
             *(double *)
              ((long)(peVar40->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0xc0);
        auVar53 = vbroadcastsd_avx512f(auVar26);
        auVar27._8_8_ = 0;
        auVar27._0_8_ =
             *(double *)
              ((long)(peVar40->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 200);
        auVar54 = vbroadcastsd_avx512f(auVar27);
        auVar28._8_8_ = 0;
        auVar28._0_8_ =
             *(double *)
              ((long)(peVar40->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0xd0);
        auVar55 = vbroadcastsd_avx512f(auVar28);
        auVar29._8_8_ = 0;
        auVar29._0_8_ =
             *(double *)
              ((long)(peVar40->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0xd8);
        auVar56 = vbroadcastsd_avx512f(auVar29);
        auVar30._8_8_ = 0;
        auVar30._0_8_ =
             *(double *)
              ((long)(peVar40->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0xe0);
        auVar57 = vbroadcastsd_avx512f(auVar30);
        auVar31._8_8_ = 0;
        auVar31._0_8_ =
             *(double *)
              ((long)(peVar40->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0xe8);
        auVar58 = vbroadcastsd_avx512f(auVar31);
        uVar48 = 0xfffffffffffffff8;
        do {
          auVar59 = vmulpd_avx512f(auVar53,*(undefined1 (*) [64])(local_4440 + uVar48 * 8));
          auVar60 = vmulpd_avx512f(auVar54,*(undefined1 (*) [64])(local_2c40 + uVar48 * 8));
          auVar59 = vaddpd_avx512f(auVar59,auVar60);
          auVar60 = vmulpd_avx512f(auVar55,*(undefined1 (*) [64])(local_2e40 + uVar48 * 8));
          auVar59 = vaddpd_avx512f(auVar59,auVar60);
          auVar60 = vmulpd_avx512f(auVar56,*(undefined1 (*) [64])(local_2040 + uVar48 * 8));
          auVar59 = vaddpd_avx512f(auVar59,auVar60);
          auVar60 = vmulpd_avx512f(auVar57,*(undefined1 (*) [64])(local_2240 + uVar48 * 8));
          auVar59 = vaddpd_avx512f(auVar59,auVar60);
          auVar60 = vmulpd_avx512f(auVar58,*(undefined1 (*) [64])(local_2a40 + uVar48 * 8));
          auVar59 = vaddpd_avx512f(auVar59,auVar60);
          *(undefined1 (*) [64])(local_4dc0 + uVar48 * 8) = auVar59;
          uVar48 = uVar48 + 8;
        } while (uVar48 < 0x38);
        auVar32._8_8_ = 0;
        auVar32._0_8_ =
             *(double *)
              ((long)(peVar40->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0xf0);
        auVar53 = vbroadcastsd_avx512f(auVar32);
        auVar33._8_8_ = 0;
        auVar33._0_8_ =
             *(double *)
              ((long)(peVar40->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0xf8);
        auVar54 = vbroadcastsd_avx512f(auVar33);
        auVar34._8_8_ = 0;
        auVar34._0_8_ =
             *(double *)
              ((long)(peVar40->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x100);
        auVar55 = vbroadcastsd_avx512f(auVar34);
        auVar35._8_8_ = 0;
        auVar35._0_8_ =
             *(double *)
              ((long)(peVar40->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x108);
        auVar56 = vbroadcastsd_avx512f(auVar35);
        auVar36._8_8_ = 0;
        auVar36._0_8_ =
             *(double *)
              ((long)(peVar40->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x110);
        auVar57 = vbroadcastsd_avx512f(auVar36);
        auVar37._8_8_ = 0;
        auVar37._0_8_ =
             *(double *)
              ((long)(peVar40->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x118);
        auVar58 = vbroadcastsd_avx512f(auVar37);
        uVar48 = 0xfffffffffffffff8;
        do {
          auVar59 = vmulpd_avx512f(auVar53,*(undefined1 (*) [64])(local_4440 + uVar48 * 8));
          auVar60 = vmulpd_avx512f(auVar54,*(undefined1 (*) [64])(local_2c40 + uVar48 * 8));
          auVar59 = vaddpd_avx512f(auVar59,auVar60);
          auVar60 = vmulpd_avx512f(auVar55,*(undefined1 (*) [64])(local_2e40 + uVar48 * 8));
          auVar59 = vaddpd_avx512f(auVar59,auVar60);
          auVar60 = vmulpd_avx512f(auVar56,*(undefined1 (*) [64])(local_2040 + uVar48 * 8));
          auVar59 = vaddpd_avx512f(auVar59,auVar60);
          auVar60 = vmulpd_avx512f(auVar57,*(undefined1 (*) [64])(local_2240 + uVar48 * 8));
          auVar59 = vaddpd_avx512f(auVar59,auVar60);
          auVar60 = vmulpd_avx512f(auVar58,*(undefined1 (*) [64])(local_2a40 + uVar48 * 8));
          auVar59 = vaddpd_avx512f(auVar59,auVar60);
          *(undefined1 (*) [64])(local_1e40 + uVar48 * 8) = auVar59;
          uVar48 = uVar48 + 8;
        } while (uVar48 < 0x38);
        local_5580 = local_4240;
        local_5400 = local_4200;
        auVar53 = vmulpd_avx512f(local_4280,local_1a80);
        auVar54 = vmulpd_avx512f(local_4080,local_1e80);
        auVar53 = vaddpd_avx512f(auVar53,auVar54);
        auVar54 = vmulpd_avx512f(local_3e80,local_4e00);
        local_1880._0_64_ = vaddpd_avx512f(auVar53,auVar54);
        auVar53 = vmulpd_avx512f(local_4240,local_1a40);
        local_5040 = local_4040;
        auVar54 = vmulpd_avx512f(local_4040,local_1e40);
        auVar53 = vaddpd_avx512f(auVar53,auVar54);
        local_5080 = local_3e40;
        auVar54 = vmulpd_avx512f(local_3e40,local_4dc0);
        local_1880._64_64_ = vaddpd_avx512f(auVar53,auVar54);
        auVar53 = vmulpd_avx512f(local_4200,local_1a00);
        local_50c0 = local_4000;
        auVar54 = vmulpd_avx512f(local_4000,local_1e00);
        auVar53 = vaddpd_avx512f(auVar53,auVar54);
        local_5100 = local_3e00;
        auVar54 = vmulpd_avx512f(local_3e00,local_4d80);
        local_1800 = vaddpd_avx512f(auVar53,auVar54);
        local_5140 = local_41c0;
        local_5180 = local_3fc0;
        auVar53 = vmulpd_avx512f(local_41c0,local_19c0);
        auVar54 = vmulpd_avx512f(local_3fc0,local_1dc0);
        auVar53 = vaddpd_avx512f(auVar53,auVar54);
        local_51c0 = local_3dc0;
        auVar54 = vmulpd_avx512f(local_3dc0,local_4d40);
        local_17c0 = vaddpd_avx512f(auVar53,auVar54);
        auVar53 = vmulpd_avx512f(local_4180,local_1980);
        local_5200 = local_3f80;
        auVar54 = vmulpd_avx512f(local_3f80,local_1d80);
        auVar53 = vaddpd_avx512f(auVar53,auVar54);
        local_5240 = local_3d80;
        auVar54 = vmulpd_avx512f(local_3d80,local_4d00);
        local_1780 = vaddpd_avx512f(auVar53,auVar54);
        local_5280 = local_4140;
        auVar53 = vmulpd_avx512f(local_4140,local_1940);
        local_52c0 = local_3f40;
        auVar54 = vmulpd_avx512f(local_3f40,local_1d40);
        auVar53 = vaddpd_avx512f(auVar53,auVar54);
        local_5300 = local_3d40;
        auVar54 = vmulpd_avx512f(local_3d40,local_4cc0);
        local_1740 = vaddpd_avx512f(auVar53,auVar54);
        local_5340 = local_4100;
        local_5380 = local_3f00;
        auVar53 = vmulpd_avx512f(local_4100,local_1900);
        auVar54 = vmulpd_avx512f(local_3f00,local_1d00);
        auVar53 = vaddpd_avx512f(auVar53,auVar54);
        local_53c0 = local_3d00;
        auVar54 = vmulpd_avx512f(local_3d00,local_4c80);
        local_1700 = vaddpd_avx512f(auVar53,auVar54);
        local_5440 = local_40c0;
        auVar53 = vmulpd_avx512f(local_40c0,local_18c0);
        local_5480 = local_3ec0;
        auVar54 = vmulpd_avx512f(local_3ec0,local_1cc0);
        auVar53 = vaddpd_avx512f(auVar53,auVar54);
        local_54c0 = local_3cc0;
        auVar54 = vmulpd_avx512f(local_3cc0,local_4c40);
        local_16c0 = vaddpd_avx512f(auVar53,auVar54);
        local_5500 = local_3c80;
        auVar53 = vmulpd_avx512f(local_1a80,local_3c80);
        local_5540 = local_3a80;
        auVar54 = vmulpd_avx512f(local_1e80,local_3a80);
        auVar53 = vaddpd_avx512f(auVar53,auVar54);
        local_55c0 = local_3880;
        auVar54 = vmulpd_avx512f(local_4e00,local_3880);
        local_1280 = vaddpd_avx512f(auVar53,auVar54);
        local_5600 = local_3c40;
        local_44c0 = local_3a40;
        auVar53 = vmulpd_avx512f(local_1a40,local_3c40);
        auVar54 = vmulpd_avx512f(local_1e40,local_3a40);
        auVar53 = vaddpd_avx512f(auVar53,auVar54);
        local_4500 = local_3840;
        auVar54 = vmulpd_avx512f(local_4dc0,local_3840);
        local_1240 = vaddpd_avx512f(auVar53,auVar54);
        local_4540 = local_3c00;
        local_4580 = local_3a00;
        auVar53 = vmulpd_avx512f(local_1a00,local_3c00);
        auVar54 = vmulpd_avx512f(local_1e00,local_3a00);
        auVar53 = vaddpd_avx512f(auVar53,auVar54);
        local_45c0 = local_3800;
        auVar54 = vmulpd_avx512f(local_4d80,local_3800);
        local_1200 = vaddpd_avx512f(auVar53,auVar54);
        local_4600 = local_3bc0;
        local_4640 = local_39c0;
        auVar53 = vmulpd_avx512f(local_19c0,local_3bc0);
        auVar54 = vmulpd_avx512f(local_1dc0,local_39c0);
        auVar53 = vaddpd_avx512f(auVar53,auVar54);
        local_4680 = local_37c0;
        auVar54 = vmulpd_avx512f(local_4d40,local_37c0);
        local_11c0 = vaddpd_avx512f(auVar53,auVar54);
        local_46c0 = local_3b80;
        local_4700 = local_3980;
        auVar53 = vmulpd_avx512f(local_1980,local_3b80);
        auVar54 = vmulpd_avx512f(local_1d80,local_3980);
        auVar53 = vaddpd_avx512f(auVar53,auVar54);
        local_4740 = local_3780;
        auVar54 = vmulpd_avx512f(local_4d00,local_3780);
        local_1180 = vaddpd_avx512f(auVar53,auVar54);
        local_4780 = local_3b40;
        local_47c0 = local_3940;
        auVar53 = vmulpd_avx512f(local_1940,local_3b40);
        auVar54 = vmulpd_avx512f(local_1d40,local_3940);
        auVar53 = vaddpd_avx512f(auVar53,auVar54);
        local_4800 = local_3740;
        auVar54 = vmulpd_avx512f(local_4cc0,local_3740);
        local_1140 = vaddpd_avx512f(auVar53,auVar54);
        local_4840 = local_3b00;
        local_4880 = local_3900;
        auVar53 = vmulpd_avx512f(local_1900,local_3b00);
        auVar54 = vmulpd_avx512f(local_1d00,local_3900);
        auVar53 = vaddpd_avx512f(auVar53,auVar54);
        local_48c0 = local_3700;
        auVar54 = vmulpd_avx512f(local_4c80,local_3700);
        local_1100 = vaddpd_avx512f(auVar53,auVar54);
        local_4900 = local_3ac0;
        local_4940 = local_38c0;
        auVar53 = vmulpd_avx512f(local_18c0,local_3ac0);
        auVar54 = vmulpd_avx512f(local_1cc0,local_38c0);
        auVar53 = vaddpd_avx512f(auVar53,auVar54);
        local_4980 = local_36c0;
        auVar54 = vmulpd_avx512f(local_4c40,local_36c0);
        local_10c0 = vaddpd_avx512f(auVar53,auVar54);
        local_49c0 = local_3680;
        auVar53 = vmulpd_avx512f(local_1a80,local_3680);
        local_4a00 = local_3480;
        auVar54 = vmulpd_avx512f(local_1e80,local_3480);
        auVar53 = vaddpd_avx512f(auVar53,auVar54);
        local_4a40 = local_3280;
        auVar54 = vmulpd_avx512f(local_4e00,local_3280);
        local_c80 = vaddpd_avx512f(auVar53,auVar54);
        local_4a80 = local_3640;
        auVar53 = vmulpd_avx512f(local_1a40,local_3640);
        local_4ac0 = local_3440;
        auVar54 = vmulpd_avx512f(local_1e40,local_3440);
        auVar53 = vaddpd_avx512f(auVar53,auVar54);
        local_4b00 = local_3240;
        auVar54 = vmulpd_avx512f(local_4dc0,local_3240);
        local_c40 = vaddpd_avx512f(auVar53,auVar54);
        local_4b40 = local_3600;
        auVar53 = vmulpd_avx512f(local_1a00,local_3600);
        local_4b80 = local_3400;
        auVar54 = vmulpd_avx512f(local_1e00,local_3400);
        auVar53 = vaddpd_avx512f(auVar53,auVar54);
        local_4bc0 = local_3200;
        auVar54 = vmulpd_avx512f(local_4d80,local_3200);
        local_c00 = vaddpd_avx512f(auVar53,auVar54);
        auVar53 = vmulpd_avx512f(local_19c0,local_35c0);
        auVar54 = vmulpd_avx512f(local_1dc0,local_33c0);
        auVar53 = vaddpd_avx512f(auVar53,auVar54);
        local_4c00 = local_31c0;
        auVar54 = vmulpd_avx512f(local_4d40,local_31c0);
        local_bc0 = vaddpd_avx512f(auVar53,auVar54);
        auVar53 = vmulpd_avx512f(local_1980,local_3580);
        auVar54 = vmulpd_avx512f(local_1d80,local_3380);
        auVar53 = vaddpd_avx512f(auVar53,auVar54);
        auVar54 = vmulpd_avx512f(local_4d00,local_3180);
        local_b80 = vaddpd_avx512f(auVar53,auVar54);
        auVar53 = vmulpd_avx512f(local_1940,local_3540);
        auVar54 = vmulpd_avx512f(local_1d40,local_3340);
        auVar53 = vaddpd_avx512f(auVar53,auVar54);
        auVar54 = vmulpd_avx512f(local_4cc0,local_3140);
        local_b40 = vaddpd_avx512f(auVar53,auVar54);
        auVar53 = vmulpd_avx512f(local_1900,local_3500);
        auVar54 = vmulpd_avx512f(local_1d00,local_3300);
        auVar53 = vaddpd_avx512f(auVar53,auVar54);
        auVar54 = vmulpd_avx512f(local_4c80,local_3100);
        local_b00 = vaddpd_avx512f(auVar53,auVar54);
        auVar53 = vmulpd_avx512f(local_18c0,local_34c0);
        auVar54 = vmulpd_avx512f(local_1cc0,local_32c0);
        auVar53 = vaddpd_avx512f(auVar53,auVar54);
        auVar54 = vmulpd_avx512f(local_4c40,local_30c0);
        local_ac0 = vaddpd_avx512f(auVar53,auVar54);
        auVar53 = vmulpd_avx512f(local_4280,local_1e80);
        auVar54 = vmulpd_avx512f(local_4080,local_1c80);
        auVar53 = vaddpd_avx512f(auVar53,auVar54);
        auVar54 = vmulpd_avx512f(local_3e80,local_5000);
        local_1680 = vaddpd_avx512f(auVar53,auVar54);
        auVar53 = vmulpd_avx512f(local_1e40,local_4240);
        auVar54 = vmulpd_avx512f(local_1c40,local_4040);
        auVar53 = vaddpd_avx512f(auVar53,auVar54);
        auVar54 = vmulpd_avx512f(local_4fc0,local_3e40);
        local_1640 = vaddpd_avx512f(auVar53,auVar54);
        auVar53 = vmulpd_avx512f(local_1e00,local_4200);
        auVar54 = vmulpd_avx512f(local_1c00,local_4000);
        auVar53 = vaddpd_avx512f(auVar53,auVar54);
        auVar54 = vmulpd_avx512f(local_4f80,local_3e00);
        local_1600 = vaddpd_avx512f(auVar53,auVar54);
        auVar53 = vmulpd_avx512f(local_1dc0,local_41c0);
        auVar54 = vmulpd_avx512f(local_1bc0,local_3fc0);
        auVar53 = vaddpd_avx512f(auVar53,auVar54);
        auVar54 = vmulpd_avx512f(local_4f40,local_3dc0);
        local_15c0 = vaddpd_avx512f(auVar53,auVar54);
        auVar53 = vmulpd_avx512f(local_4180,local_1d80);
        auVar54 = vmulpd_avx512f(local_1b80,local_3f80);
        auVar53 = vaddpd_avx512f(auVar53,auVar54);
        auVar54 = vmulpd_avx512f(local_4f00,local_3d80);
        local_1580 = vaddpd_avx512f(auVar53,auVar54);
        auVar53 = vmulpd_avx512f(local_1d40,local_4140);
        auVar54 = vmulpd_avx512f(local_1b40,local_3f40);
        auVar53 = vaddpd_avx512f(auVar53,auVar54);
        auVar54 = vmulpd_avx512f(local_4ec0,local_3d40);
        local_1540 = vaddpd_avx512f(auVar53,auVar54);
        auVar53 = vmulpd_avx512f(local_1d00,local_4100);
        auVar54 = vmulpd_avx512f(local_1b00,local_3f00);
        auVar53 = vaddpd_avx512f(auVar53,auVar54);
        auVar54 = vmulpd_avx512f(local_4e80,local_3d00);
        local_1500 = vaddpd_avx512f(auVar53,auVar54);
        auVar53 = vmulpd_avx512f(local_1cc0,local_40c0);
        auVar54 = vmulpd_avx512f(local_1ac0,local_3ec0);
        auVar53 = vaddpd_avx512f(auVar53,auVar54);
        auVar54 = vmulpd_avx512f(local_4e40,local_3cc0);
        local_14c0 = vaddpd_avx512f(auVar53,auVar54);
        auVar53 = vmulpd_avx512f(local_1e80,local_3c80);
        auVar54 = vmulpd_avx512f(local_1c80,local_3a80);
        auVar53 = vaddpd_avx512f(auVar53,auVar54);
        auVar54 = vmulpd_avx512f(local_5000,local_3880);
        local_1080 = vaddpd_avx512f(auVar53,auVar54);
        auVar53 = vmulpd_avx512f(local_1e40,local_3c40);
        auVar54 = vmulpd_avx512f(local_1c40,local_3a40);
        auVar53 = vaddpd_avx512f(auVar53,auVar54);
        auVar54 = vmulpd_avx512f(local_4fc0,local_3840);
        local_1040 = vaddpd_avx512f(auVar53,auVar54);
        auVar53 = vmulpd_avx512f(local_1e00,local_3c00);
        auVar54 = vmulpd_avx512f(local_1c00,local_3a00);
        auVar53 = vaddpd_avx512f(auVar53,auVar54);
        auVar54 = vmulpd_avx512f(local_4f80,local_3800);
        local_1000 = vaddpd_avx512f(auVar53,auVar54);
        auVar53 = vmulpd_avx512f(local_1dc0,local_3bc0);
        auVar54 = vmulpd_avx512f(local_1bc0,local_39c0);
        auVar53 = vaddpd_avx512f(auVar53,auVar54);
        auVar54 = vmulpd_avx512f(local_4f40,local_37c0);
        local_fc0 = vaddpd_avx512f(auVar53,auVar54);
        auVar53 = vmulpd_avx512f(local_1d80,local_3b80);
        auVar54 = vmulpd_avx512f(local_1b80,local_3980);
        auVar53 = vaddpd_avx512f(auVar53,auVar54);
        auVar54 = vmulpd_avx512f(local_4f00,local_3780);
        local_f80 = vaddpd_avx512f(auVar53,auVar54);
        auVar53 = vmulpd_avx512f(local_1d40,local_3b40);
        auVar54 = vmulpd_avx512f(local_1b40,local_3940);
        auVar53 = vaddpd_avx512f(auVar53,auVar54);
        auVar54 = vmulpd_avx512f(local_4ec0,local_3740);
        local_f40 = vaddpd_avx512f(auVar53,auVar54);
        auVar53 = vmulpd_avx512f(local_1d00,local_3b00);
        auVar54 = vmulpd_avx512f(local_1b00,local_3900);
        auVar53 = vaddpd_avx512f(auVar53,auVar54);
        auVar54 = vmulpd_avx512f(local_4e80,local_3700);
        local_f00 = vaddpd_avx512f(auVar53,auVar54);
        auVar53 = vmulpd_avx512f(local_1cc0,local_3ac0);
        auVar54 = vmulpd_avx512f(local_1ac0,local_38c0);
        auVar53 = vaddpd_avx512f(auVar53,auVar54);
        auVar54 = vmulpd_avx512f(local_4e40,local_36c0);
        local_ec0 = vaddpd_avx512f(auVar53,auVar54);
        auVar53 = vmulpd_avx512f(local_1e80,local_3680);
        auVar54 = vmulpd_avx512f(local_1c80,local_3480);
        auVar53 = vaddpd_avx512f(auVar53,auVar54);
        auVar54 = vmulpd_avx512f(local_5000,local_3280);
        local_a80 = vaddpd_avx512f(auVar53,auVar54);
        auVar53 = vmulpd_avx512f(local_1e40,local_3640);
        auVar54 = vmulpd_avx512f(local_1c40,local_3440);
        auVar53 = vaddpd_avx512f(auVar53,auVar54);
        auVar54 = vmulpd_avx512f(local_4fc0,local_3240);
        local_a40 = vaddpd_avx512f(auVar53,auVar54);
        auVar53 = vmulpd_avx512f(local_1e00,local_3600);
        auVar54 = vmulpd_avx512f(local_1c00,local_3400);
        auVar53 = vaddpd_avx512f(auVar53,auVar54);
        auVar54 = vmulpd_avx512f(local_4f80,local_3200);
        local_a00 = vaddpd_avx512f(auVar53,auVar54);
        auVar53 = vmulpd_avx512f(local_1dc0,local_35c0);
        auVar54 = vmulpd_avx512f(local_33c0,local_1bc0);
        auVar53 = vaddpd_avx512f(auVar53,auVar54);
        auVar54 = vmulpd_avx512f(local_4f40,local_31c0);
        local_9c0 = vaddpd_avx512f(auVar53,auVar54);
        auVar53 = vmulpd_avx512f(local_1d80,local_3580);
        auVar54 = vmulpd_avx512f(local_3380,local_1b80);
        auVar53 = vaddpd_avx512f(auVar53,auVar54);
        auVar54 = vmulpd_avx512f(local_3180,local_4f00);
        local_980 = vaddpd_avx512f(auVar53,auVar54);
        auVar53 = vmulpd_avx512f(local_3540,local_1d40);
        auVar54 = vmulpd_avx512f(local_3340,local_1b40);
        auVar53 = vaddpd_avx512f(auVar53,auVar54);
        auVar54 = vmulpd_avx512f(local_3140,local_4ec0);
        local_940 = vaddpd_avx512f(auVar53,auVar54);
        auVar53 = vmulpd_avx512f(local_3500,local_1d00);
        auVar54 = vmulpd_avx512f(local_3300,local_1b00);
        auVar53 = vaddpd_avx512f(auVar53,auVar54);
        auVar54 = vmulpd_avx512f(local_3100,local_4e80);
        local_900 = vaddpd_avx512f(auVar53,auVar54);
        auVar53 = vmulpd_avx512f(local_34c0,local_1cc0);
        auVar54 = vmulpd_avx512f(local_32c0,local_1ac0);
        auVar53 = vaddpd_avx512f(auVar53,auVar54);
        auVar54 = vmulpd_avx512f(local_30c0,local_4e40);
        local_8c0 = vaddpd_avx512f(auVar53,auVar54);
        auVar53 = vmulpd_avx512f(local_4280,local_4e00);
        auVar54 = vmulpd_avx512f(local_4080,local_5000);
        auVar53 = vaddpd_avx512f(auVar53,auVar54);
        auVar54 = vmulpd_avx512f(local_3e80,local_3080);
        local_1480 = vaddpd_avx512f(auVar53,auVar54);
        auVar53 = vmulpd_avx512f(local_4240,local_4dc0);
        auVar54 = vmulpd_avx512f(local_4040,local_4fc0);
        auVar53 = vaddpd_avx512f(auVar53,auVar54);
        auVar54 = vmulpd_avx512f(local_3e40,local_3040);
        local_1440 = vaddpd_avx512f(auVar53,auVar54);
        auVar53 = vmulpd_avx512f(local_4200,local_4d80);
        auVar54 = vmulpd_avx512f(local_4000,local_4f80);
        auVar53 = vaddpd_avx512f(auVar53,auVar54);
        auVar54 = vmulpd_avx512f(local_3e00,local_3000);
        local_1400 = vaddpd_avx512f(auVar53,auVar54);
        auVar53 = vmulpd_avx512f(local_41c0,local_4d40);
        auVar54 = vmulpd_avx512f(local_3fc0,local_4f40);
        auVar53 = vaddpd_avx512f(auVar53,auVar54);
        auVar54 = vmulpd_avx512f(local_3dc0,local_2fc0);
        local_13c0 = vaddpd_avx512f(auVar53,auVar54);
        auVar53 = vmulpd_avx512f(local_4180,local_4d00);
        auVar54 = vmulpd_avx512f(local_3f80,local_4f00);
        auVar53 = vaddpd_avx512f(auVar53,auVar54);
        auVar54 = vmulpd_avx512f(local_3d80,local_2f80);
        local_1380 = vaddpd_avx512f(auVar53,auVar54);
        auVar53 = vmulpd_avx512f(local_4140,local_4cc0);
        auVar54 = vmulpd_avx512f(local_3f40,local_4ec0);
        auVar53 = vaddpd_avx512f(auVar53,auVar54);
        auVar54 = vmulpd_avx512f(local_3d40,local_2f40);
        local_1340 = vaddpd_avx512f(auVar53,auVar54);
        auVar53 = vmulpd_avx512f(local_4100,local_4c80);
        auVar54 = vmulpd_avx512f(local_3f00,local_4e80);
        auVar53 = vaddpd_avx512f(auVar53,auVar54);
        auVar54 = vmulpd_avx512f(local_3d00,local_2f00);
        local_1300 = vaddpd_avx512f(auVar53,auVar54);
        auVar53 = vmulpd_avx512f(local_40c0,local_4c40);
        auVar54 = vmulpd_avx512f(local_3ec0,local_4e40);
        auVar53 = vaddpd_avx512f(auVar53,auVar54);
        auVar54 = vmulpd_avx512f(local_3cc0,local_2ec0);
        local_12c0 = vaddpd_avx512f(auVar53,auVar54);
        auVar53 = vmulpd_avx512f(local_3c80,local_4e00);
        auVar54 = vmulpd_avx512f(local_3a80,local_5000);
        auVar53 = vaddpd_avx512f(auVar53,auVar54);
        auVar54 = vmulpd_avx512f(local_3880,local_3080);
        local_e80 = vaddpd_avx512f(auVar53,auVar54);
        auVar53 = vmulpd_avx512f(local_3c40,local_4dc0);
        auVar54 = vmulpd_avx512f(local_3a40,local_4fc0);
        auVar53 = vaddpd_avx512f(auVar53,auVar54);
        auVar54 = vmulpd_avx512f(local_3840,local_3040);
        local_e40 = vaddpd_avx512f(auVar53,auVar54);
        auVar53 = vmulpd_avx512f(local_3c00,local_4d80);
        auVar54 = vmulpd_avx512f(local_3a00,local_4f80);
        auVar53 = vaddpd_avx512f(auVar53,auVar54);
        auVar54 = vmulpd_avx512f(local_3800,local_3000);
        local_e00 = vaddpd_avx512f(auVar53,auVar54);
        auVar53 = vmulpd_avx512f(local_3bc0,local_4d40);
        auVar54 = vmulpd_avx512f(local_39c0,local_4f40);
        auVar53 = vaddpd_avx512f(auVar53,auVar54);
        auVar54 = vmulpd_avx512f(local_37c0,local_2fc0);
        local_dc0 = vaddpd_avx512f(auVar53,auVar54);
        auVar53 = vmulpd_avx512f(local_3b80,local_4d00);
        auVar54 = vmulpd_avx512f(local_3980,local_4f00);
        auVar53 = vaddpd_avx512f(auVar53,auVar54);
        auVar54 = vmulpd_avx512f(local_3780,local_2f80);
        local_d80 = vaddpd_avx512f(auVar53,auVar54);
        auVar53 = vmulpd_avx512f(local_3b40,local_4cc0);
        auVar54 = vmulpd_avx512f(local_3940,local_4ec0);
        auVar53 = vaddpd_avx512f(auVar53,auVar54);
        auVar54 = vmulpd_avx512f(local_3740,local_2f40);
        local_d40 = vaddpd_avx512f(auVar53,auVar54);
        auVar53 = vmulpd_avx512f(local_3b00,local_4c80);
        auVar54 = vmulpd_avx512f(local_3900,local_4e80);
        auVar53 = vaddpd_avx512f(auVar53,auVar54);
        auVar54 = vmulpd_avx512f(local_3700,local_2f00);
        local_d00 = vaddpd_avx512f(auVar53,auVar54);
        auVar53 = vmulpd_avx512f(local_3ac0,local_4c40);
        auVar54 = vmulpd_avx512f(local_38c0,local_4e40);
        auVar53 = vaddpd_avx512f(auVar53,auVar54);
        auVar54 = vmulpd_avx512f(local_36c0,local_2ec0);
        local_cc0 = vaddpd_avx512f(auVar53,auVar54);
        auVar53 = vmulpd_avx512f(local_3680,local_4e00);
        auVar54 = vmulpd_avx512f(local_3480,local_5000);
        auVar53 = vaddpd_avx512f(auVar53,auVar54);
        auVar54 = vmulpd_avx512f(local_3280,local_3080);
        local_880 = vaddpd_avx512f(auVar53,auVar54);
        auVar53 = vmulpd_avx512f(local_3640,local_4dc0);
        auVar54 = vmulpd_avx512f(local_3440,local_4fc0);
        auVar53 = vaddpd_avx512f(auVar53,auVar54);
        auVar54 = vmulpd_avx512f(local_3240,local_3040);
        local_840 = vaddpd_avx512f(auVar53,auVar54);
        auVar53 = vmulpd_avx512f(local_3600,local_4d80);
        auVar54 = vmulpd_avx512f(local_3400,local_4f80);
        auVar53 = vaddpd_avx512f(auVar53,auVar54);
        auVar54 = vmulpd_avx512f(local_3200,local_3000);
        local_800 = vaddpd_avx512f(auVar53,auVar54);
        auVar53 = vmulpd_avx512f(local_35c0,local_4d40);
        auVar54 = vmulpd_avx512f(local_33c0,local_4f40);
        auVar53 = vaddpd_avx512f(auVar53,auVar54);
        auVar54 = vmulpd_avx512f(local_31c0,local_2fc0);
        local_7c0 = vaddpd_avx512f(auVar53,auVar54);
        auVar53 = vmulpd_avx512f(local_3580,local_4d00);
        auVar54 = vmulpd_avx512f(local_3380,local_4f00);
        auVar53 = vaddpd_avx512f(auVar53,auVar54);
        auVar54 = vmulpd_avx512f(local_3180,local_2f80);
        local_780 = vaddpd_avx512f(auVar53,auVar54);
        auVar53 = vmulpd_avx512f(local_3540,local_4cc0);
        auVar54 = vmulpd_avx512f(local_3340,local_4ec0);
        auVar53 = vaddpd_avx512f(auVar53,auVar54);
        auVar54 = vmulpd_avx512f(local_3140,local_2f40);
        local_740 = vaddpd_avx512f(auVar53,auVar54);
        auVar53 = vmulpd_avx512f(local_3500,local_4c80);
        auVar54 = vmulpd_avx512f(local_3300,local_4e80);
        auVar53 = vaddpd_avx512f(auVar53,auVar54);
        auVar54 = vmulpd_avx512f(local_3100,local_2f00);
        local_700 = vaddpd_avx512f(auVar53,auVar54);
        auVar53 = vmulpd_avx512f(local_34c0,local_4c40);
        auVar54 = vmulpd_avx512f(local_32c0,local_4e40);
        auVar53 = vaddpd_avx512f(auVar53,auVar54);
        auVar54 = vmulpd_avx512f(local_30c0,local_2ec0);
        local_6c0 = vaddpd_avx512f(auVar53,auVar54);
        if ((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
            m_cols != 0xc0) {
          pcVar52 = 
          "Eigen::Product<Eigen::Matrix<double, -1, -1, 1>, Eigen::Matrix<double, 192, 3, 0>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, -1, -1, 1>, Rhs = Eigen::Matrix<double, 192, 3, 0>, Option = 0]"
          ;
          goto LAB_00705640;
        }
        if ((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
            m_rows == 0x20) {
          memset(&local_680,0,0x300);
          local_5608 = 1.0;
          Eigen::internal::
          generic_product_impl<Eigen::Matrix<double,-1,-1,1,-1,-1>,Eigen::Matrix<double,192,3,0,192,3>,Eigen::DenseShape,Eigen::DenseShape,8>
          ::scaleAndAddTo<Eigen::Matrix<double,32,3,1,32,3>>
                    (&local_680,&this->m_SD,(Matrix<double,_192,_3,_0,_192,_3> *)local_1880,
                     &local_5608);
          if ((Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
              != 0x60) {
            pdVar51 = (Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
                      .m_data;
            if (pdVar51 != (double *)0x0) {
              free((void *)pdVar51[-1]);
            }
            pvVar49 = malloc(0x340);
            if (pvVar49 == (void *)0x0) {
              pdVar51 = (double *)0x0;
            }
            else {
              *(void **)(((ulong)pvVar49 & 0xffffffffffffffc0) + 0x38) = pvVar49;
              pdVar51 = (double *)(((ulong)pvVar49 & 0xffffffffffffffc0) + 0x40);
            }
            if (pdVar51 == (double *)0x0) {
              puVar50 = (undefined8 *)__cxa_allocate_exception(8);
              *puVar50 = std::ostream::_M_insert<bool>;
              __cxa_throw(puVar50,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
            }
            (Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data =
                 pdVar51;
            (Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows =
                 0x60;
          }
          if ((Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
              == 0x60) {
            pdVar51 = (Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
                      .m_data;
            uVar48 = 0xfffffffffffffff8;
            do {
              dVar41 = local_680.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_1,_32,_3>_>.
                       m_storage.m_data.array[uVar48 + 9];
              dVar42 = local_680.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_1,_32,_3>_>.
                       m_storage.m_data.array[uVar48 + 10];
              dVar43 = local_680.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_1,_32,_3>_>.
                       m_storage.m_data.array[uVar48 + 0xb];
              dVar44 = local_680.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_1,_32,_3>_>.
                       m_storage.m_data.array[uVar48 + 0xc];
              dVar45 = local_680.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_1,_32,_3>_>.
                       m_storage.m_data.array[uVar48 + 0xd];
              dVar46 = local_680.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_1,_32,_3>_>.
                       m_storage.m_data.array[uVar48 + 0xe];
              dVar47 = local_680.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_1,_32,_3>_>.
                       m_storage.m_data.array[uVar48 + 0xf];
              pdVar1 = pdVar51 + uVar48 + 8;
              *pdVar1 = local_680.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_1,_32,_3>_>.
                        m_storage.m_data.array[uVar48 + 8];
              pdVar1[1] = dVar41;
              pdVar1[2] = dVar42;
              pdVar1[3] = dVar43;
              pdVar1[4] = dVar44;
              pdVar1[5] = dVar45;
              pdVar1[6] = dVar46;
              pdVar1[7] = dVar47;
              uVar48 = uVar48 + 8;
            } while (uVar48 < 0x58);
            return;
          }
          __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                        "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,
                        "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Map<Eigen::Matrix<double, 96, 1>>, T1 = double, T2 = double]"
                       );
        }
        pcVar52 = 
        "void Eigen::PlainObjectBase<Eigen::Matrix<double, 32, 3, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, 32, 3, 1>]"
        ;
        goto LAB_00705662;
      }
      pcVar52 = 
      "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::ArrayWrapper<Eigen::Matrix<double, 64, 1>>, SrcXprType = Eigen::ArrayWrapper<Eigen::Matrix<double, -1, -1>>, Functor = Eigen::internal::mul_assign_op<double>]"
      ;
    }
    else {
      pcVar52 = 
      "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::ArrayWrapper<Eigen::Matrix<double, 64, 1>>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Array<double, -1, -1>>, const Eigen::ArrayWrapper<Eigen::Matrix<double, -1, -1>>>, Functor = Eigen::internal::mul_assign_op<double>]"
      ;
    }
    __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                  "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,pcVar52);
  }
  pcVar52 = 
  "void Eigen::PlainObjectBase<Eigen::Matrix<double, 192, 3, 0>>::resize(Index, Index) [Derived = Eigen::Matrix<double, 192, 3, 0>]"
  ;
LAB_00705662:
  __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,pcVar52);
}

Assistant:

void ChElementHexaANCF_3843::ComputeInternalForcesContIntNoDamping(ChVectorDynamic<>& Fi) {
    // Calculate the generalize internal force vector using the "Continuous Integration" style of method assuming a
    // linear material model (no damping).  For this style of method, the generalized internal force vector is
    // integrated across the volume of the element every time this calculation is performed.  For this element, this is
    // likely more efficient than the "Pre-Integration" style calculation method.  Note that the integrand for the
    // generalize internal force vector for a straight and normalized element is of order : 12 in xi, 12 in eta, and 12
    // in zeta. This requires GQ 7 points along the xi, eta, and zeta directions for "Full Integration". However, very
    // similar results can be obtained with fewer GQ point in each direction, resulting in significantly fewer
    // calculations.  Based on testing, this could be as low as 4x4x4

    Matrix3xN e_bar;
    CalcCoordMatrix(e_bar);

    // =============================================================================
    // Calculate the deformation gradient for all Gauss quadrature points in a single matrix multiplication.  Note
    // that since the shape function derivative matrix is ordered by columns, the resulting deformation gradient
    // will be ordered by block matrix (column vectors) components
    // Note that the indices of the components are in transposed order
    //      [F11  F21  F31 ]
    // FC = [F12  F22  F32 ]
    //      [F13  F23  F33 ]
    // =============================================================================

    ChMatrixNMc<double, 3 * NIP, 3> FC = m_SD.transpose() * e_bar.transpose();

    // =============================================================================
    // Calculate each individual value of the Green-Lagrange strain component by component across all the
    // Gauss-Quadrature points at a time to better leverage vectorized CPU instructions.
    // The result is then scaled by minus the Gauss quadrature weight times the element Jacobian at the
    // corresponding Gauss point (m_kGQ) for efficiency.
    // Results are written in Voigt notation: epsilon = [E11,E22,E33,2*E23,2*E13,2*E12]
    // =============================================================================

    // Each entry in E1 = kGQ*E11 = kGQ*1/2*(F11*F11+F21*F21+F31*F31-1)
    VectorNIP E1_Block = FC.template block<NIP, 1>(0, 0).cwiseProduct(FC.template block<NIP, 1>(0, 0)) +
                         FC.template block<NIP, 1>(0, 1).cwiseProduct(FC.template block<NIP, 1>(0, 1)) +
                         FC.template block<NIP, 1>(0, 2).cwiseProduct(FC.template block<NIP, 1>(0, 2));
    E1_Block.array() -= 1;
    E1_Block.array() *= 0.5 * m_kGQ.array();

    // Each entry in E2 = kGQ*E22 = kGQ*1/2*(F12*F12+F22*F22+F32*F32-1)
    VectorNIP E2_Block = FC.template block<NIP, 1>(NIP, 0).cwiseProduct(FC.template block<NIP, 1>(NIP, 0)) +
                         FC.template block<NIP, 1>(NIP, 1).cwiseProduct(FC.template block<NIP, 1>(NIP, 1)) +
                         FC.template block<NIP, 1>(NIP, 2).cwiseProduct(FC.template block<NIP, 1>(NIP, 2));
    E2_Block.array() -= 1;
    E2_Block.array() *= 0.5 * m_kGQ.array();

    // Each entry in E3 = kGQ*E33 = kGQ*1/2*(F13*F13+F23*F23+F33*F33-1)
    VectorNIP E3_Block = FC.template block<NIP, 1>(2 * NIP, 0).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 0)) +
                         FC.template block<NIP, 1>(2 * NIP, 1).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 1)) +
                         FC.template block<NIP, 1>(2 * NIP, 2).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 2));
    E3_Block.array() -= 1;
    E3_Block.array() *= 0.5 * m_kGQ.array();

    // Each entry in E4 = kGQ*2*E23 = kGQ*(F12*F13+F22*F23+F32*F33)
    VectorNIP E4_Block = FC.template block<NIP, 1>(NIP, 0).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 0)) +
                         FC.template block<NIP, 1>(NIP, 1).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 1)) +
                         FC.template block<NIP, 1>(NIP, 2).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 2));
    E4_Block.array() *= m_kGQ.array();

    // Each entry in E5 = kGQ*2*E13 = kGQ*(F11*F13+F21*F23+F31*F33)
    VectorNIP E5_Block = FC.template block<NIP, 1>(0, 0).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 0)) +
                         FC.template block<NIP, 1>(0, 1).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 1)) +
                         FC.template block<NIP, 1>(0, 2).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 2));
    E5_Block.array() *= m_kGQ.array();

    // Each entry in E6 = kGQ*2*E12 = (F11*F12+F21*F22+F31*F32)
    VectorNIP E6_Block = FC.template block<NIP, 1>(0, 0).cwiseProduct(FC.template block<NIP, 1>(NIP, 0)) +
                         FC.template block<NIP, 1>(0, 1).cwiseProduct(FC.template block<NIP, 1>(NIP, 1)) +
                         FC.template block<NIP, 1>(0, 2).cwiseProduct(FC.template block<NIP, 1>(NIP, 2));
    E6_Block.array() *= m_kGQ.array();

    // =============================================================================
    // Get the stiffness tensor in 6x6 matrix form
    // =============================================================================

    const ChMatrixNM<double, 6, 6>& D = GetMaterial()->Get_D();

    // =============================================================================
    // Calculate the 2nd Piola-Kirchoff stresses in Voigt notation across all the Gauss quadrature points at a time
    // component by component. Note that the Green-Largrange strain components have been scaled by minus the Gauss
    // quadrature weight times the element Jacobian at the corresponding Gauss point to make the calculation of the 2nd
    // Piola-Kirchoff stresses more efficient.
    //  kGQ*SPK2 = kGQ*[SPK2_11,SPK2_22,SPK2_33,SPK2_23,SPK2_13,SPK2_12] = D * E_Combined
    // =============================================================================

    VectorNIP SPK2_1_Block = D(0, 0) * E1_Block + D(0, 1) * E2_Block + D(0, 2) * E3_Block + D(0, 3) * E4_Block +
                             D(0, 4) * E5_Block + D(0, 5) * E6_Block;
    VectorNIP SPK2_2_Block = D(1, 0) * E1_Block + D(1, 1) * E2_Block + D(1, 2) * E3_Block + D(1, 3) * E4_Block +
                             D(1, 4) * E5_Block + D(1, 5) * E6_Block;
    VectorNIP SPK2_3_Block = D(2, 0) * E1_Block + D(2, 1) * E2_Block + D(2, 2) * E3_Block + D(2, 3) * E4_Block +
                             D(2, 4) * E5_Block + D(2, 5) * E6_Block;
    VectorNIP SPK2_4_Block = D(3, 0) * E1_Block + D(3, 1) * E2_Block + D(3, 2) * E3_Block + D(3, 3) * E4_Block +
                             D(3, 4) * E5_Block + D(3, 5) * E6_Block;
    VectorNIP SPK2_5_Block = D(4, 0) * E1_Block + D(4, 1) * E2_Block + D(4, 2) * E3_Block + D(4, 3) * E4_Block +
                             D(4, 4) * E5_Block + D(4, 5) * E6_Block;
    VectorNIP SPK2_6_Block = D(5, 0) * E1_Block + D(5, 1) * E2_Block + D(5, 2) * E3_Block + D(5, 3) * E4_Block +
                             D(5, 4) * E5_Block + D(5, 5) * E6_Block;

    // =============================================================================
    // Calculate the transpose of the 1st Piola-Kirchoff stresses in block tensor form whose entries have been
    // scaled by minus the Gauss quadrature weight times the element Jacobian at the corresponding Gauss point.
    // The entries are grouped by component in block matrices (column vectors)
    // P_Block = kGQ*P_transpose = kGQ*SPK2*F_transpose
    //           [kGQ*(P_transpose)_11  kGQ*(P_transpose)_12  kGQ*(P_transpose)_13 ]
    //         = [kGQ*(P_transpose)_21  kGQ*(P_transpose)_22  kGQ*(P_transpose)_23 ]
    //           [kGQ*(P_transpose)_31  kGQ*(P_transpose)_32  kGQ*(P_transpose)_33 ]
    // =============================================================================

    ChMatrixNMc<double, 3 * NIP, 3> P_Block;

    P_Block.template block<NIP, 1>(0, 0) = FC.template block<NIP, 1>(0, 0).cwiseProduct(SPK2_1_Block) +
                                           FC.template block<NIP, 1>(NIP, 0).cwiseProduct(SPK2_6_Block) +
                                           FC.template block<NIP, 1>(2 * NIP, 0).cwiseProduct(SPK2_5_Block);
    P_Block.template block<NIP, 1>(0, 1) = FC.template block<NIP, 1>(0, 1).cwiseProduct(SPK2_1_Block) +
                                           FC.template block<NIP, 1>(NIP, 1).cwiseProduct(SPK2_6_Block) +
                                           FC.template block<NIP, 1>(2 * NIP, 1).cwiseProduct(SPK2_5_Block);
    P_Block.template block<NIP, 1>(0, 2) = FC.template block<NIP, 1>(0, 2).cwiseProduct(SPK2_1_Block) +
                                           FC.template block<NIP, 1>(NIP, 2).cwiseProduct(SPK2_6_Block) +
                                           FC.template block<NIP, 1>(2 * NIP, 2).cwiseProduct(SPK2_5_Block);

    P_Block.template block<NIP, 1>(NIP, 0) = FC.template block<NIP, 1>(0, 0).cwiseProduct(SPK2_6_Block) +
                                             FC.template block<NIP, 1>(NIP, 0).cwiseProduct(SPK2_2_Block) +
                                             FC.template block<NIP, 1>(2 * NIP, 0).cwiseProduct(SPK2_4_Block);
    P_Block.template block<NIP, 1>(NIP, 1) = FC.template block<NIP, 1>(0, 1).cwiseProduct(SPK2_6_Block) +
                                             FC.template block<NIP, 1>(NIP, 1).cwiseProduct(SPK2_2_Block) +
                                             FC.template block<NIP, 1>(2 * NIP, 1).cwiseProduct(SPK2_4_Block);
    P_Block.template block<NIP, 1>(NIP, 2) = FC.template block<NIP, 1>(0, 2).cwiseProduct(SPK2_6_Block) +
                                             FC.template block<NIP, 1>(NIP, 2).cwiseProduct(SPK2_2_Block) +
                                             FC.template block<NIP, 1>(2 * NIP, 2).cwiseProduct(SPK2_4_Block);

    P_Block.template block<NIP, 1>(2 * NIP, 0) = FC.template block<NIP, 1>(0, 0).cwiseProduct(SPK2_5_Block) +
                                                 FC.template block<NIP, 1>(NIP, 0).cwiseProduct(SPK2_4_Block) +
                                                 FC.template block<NIP, 1>(2 * NIP, 0).cwiseProduct(SPK2_3_Block);
    P_Block.template block<NIP, 1>(2 * NIP, 1) = FC.template block<NIP, 1>(0, 1).cwiseProduct(SPK2_5_Block) +
                                                 FC.template block<NIP, 1>(NIP, 1).cwiseProduct(SPK2_4_Block) +
                                                 FC.template block<NIP, 1>(2 * NIP, 1).cwiseProduct(SPK2_3_Block);
    P_Block.template block<NIP, 1>(2 * NIP, 2) = FC.template block<NIP, 1>(0, 2).cwiseProduct(SPK2_5_Block) +
                                                 FC.template block<NIP, 1>(NIP, 2).cwiseProduct(SPK2_4_Block) +
                                                 FC.template block<NIP, 1>(2 * NIP, 2).cwiseProduct(SPK2_3_Block);

    // =============================================================================
    // Multiply the scaled first Piola-Kirchoff stresses by the shape function derivative matrix to get the generalized
    // force vector in matrix form (in the correct order if its calculated in row-major memory layout)
    // =============================================================================

    MatrixNx3 QiCompact = m_SD * P_Block;

    // =============================================================================
    // Reshape the compact matrix form of the generalized internal force vector (stored using a row-major memory layout)
    // into its actual column vector format.  This is done by mathematically stacking the transpose of each row on top
    // of each other forming the column vector.  Due to the memory organization this is simply a reinterpretation of the
    // data
    // =============================================================================

    Eigen::Map<Vector3N> QiReshaped(QiCompact.data(), QiCompact.size());
    Fi = QiReshaped;
}